

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextHtmlExporter::emitTable(QTextHtmlExporter *this,QTextTable *table)

{
  QTextCharFormat *rhs;
  qreal qVar1;
  bool bVar2;
  Alignment align;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Data *__size;
  size_t allocSize;
  Data *size;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  int col;
  long in_FS_OFFSET;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QLatin1String QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QTextLength QVar21;
  QVarLengthArray<bool,_256LL> widthEmittedForColumn;
  undefined1 local_230 [8];
  undefined1 local_228 [32];
  QList<QTextLength> local_208;
  QString local_1e8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QLatin1String> local_188;
  QString local_150;
  undefined1 local_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_198._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_198._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::format((QTextTable *)local_198);
  QVar11.m_data = (char *)0x7;
  QVar11.m_size = (qsizetype)this;
  QString::append(QVar11);
  bVar2 = QTextFormat::hasProperty((QTextFormat *)local_198,0x4000);
  if (bVar2) {
    qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_198,0x4000);
    QString::number(qVar1,(char)&local_150,0x67);
    emitAttribute(this,"border",&local_150);
    if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  emitFrameStyle(this,(QTextFrameFormat *)local_198,TableFrame);
  align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
       QTextFormat::intProperty((QTextFormat *)local_198,0x1010);
  emitAlignment(this,align);
  QVar21 = QTextFormat::lengthProperty((QTextFormat *)local_198,0x4003);
  local_150.d.d = (Data *)CONCAT44(local_150.d.d._4_4_,QVar21.lengthType);
  local_150.d.ptr = (char16_t *)QVar21.fixedValueOrPercentage;
  emitTextLength(this,"width",(QTextLength *)&local_150);
  bVar2 = QTextFormat::hasProperty((QTextFormat *)local_198,0x4102);
  if (bVar2) {
    qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_198,0x4102);
    QString::number(qVar1,(char)&local_150,0x67);
    emitAttribute(this,"cellspacing",&local_150);
    if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  bVar2 = QTextFormat::hasProperty((QTextFormat *)local_198,0x4103);
  if (bVar2) {
    qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_198,0x4103);
    QString::number(qVar1,(char)&local_150,0x67);
    emitAttribute(this,"cellpadding",&local_150);
    if (&(local_150.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_150.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_150.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  emitBackgroundAttribute(this,(QTextFormat *)local_198);
  QString::append((QChar)(char16_t)this);
  iVar3 = QTextTable::rows(table);
  uVar4 = QTextTable::columns(table);
  local_208.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_208.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_208.d.ptr = (QTextLength *)&DAT_aaaaaaaaaaaaaaaa;
  QTextFormat::lengthVectorProperty(&local_208,(QTextFormat *)local_198,0x4101);
  size = (Data *)(long)(int)uVar4;
  if ((QFontPrivate *)local_208.d.size == (QFontPrivate *)0x0) {
    QList<QTextLength>::resize(&local_208,(qsizetype)size);
    local_150.d.d = (Data *)((ulong)local_150.d.d & 0xffffffff00000000);
    local_150.d.ptr = (char16_t *)0x0;
    QList<QTextLength>::fill(&local_208,(parameter_type)&local_150,-1);
  }
  memset(&local_150,0xaa,0x118);
  local_150.d.d = (Data *)0x100;
  local_150.d.ptr = (char16_t *)0x0;
  local_150.d.size = (qsizetype)local_138;
  if (0x100 < (int)uVar4) {
    local_150.d.d = size;
    __size = (Data *)QtPrivate::expectedAllocSize((ulong)size,0x10);
    if (__size == (Data *)0x0) {
      __size = size;
    }
    local_150.d.size = (qsizetype)malloc((size_t)__size);
    local_150.d.d = __size;
  }
  local_150.d.ptr = (char16_t *)size;
  if (0 < (int)uVar4) {
    memset((void *)local_150.d.size,0,(ulong)uVar4);
  }
  iVar5 = QTextFormat::intProperty((QTextFormat *)local_198,0x4104);
  if (iVar3 <= iVar5) {
    iVar5 = iVar3;
  }
  if (0 < iVar5) {
    QVar12.m_data = (char *)0x7;
    QVar12.m_size = (qsizetype)this;
    QString::append(QVar12);
  }
  if (0 < iVar3) {
    rhs = &this->defaultCharFormat;
    col = 0;
    do {
      QVar13.m_data = &DAT_00000005;
      QVar13.m_size = (qsizetype)this;
      QString::append(QVar13);
      if (0 < (int)uVar4) {
        uVar10 = 0;
        do {
          local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QTextTable::cellAt((QTextTable *)local_1a8,(int)table,col);
          iVar6 = QTextTableCell::row((QTextTableCell *)local_1a8);
          if ((iVar6 == col) &&
             (uVar7 = QTextTableCell::column((QTextTableCell *)local_1a8), uVar10 == uVar7)) {
            QVar14.m_data = (char *)0x4;
            QVar14.m_size = (qsizetype)this;
            QString::append(QVar14);
            if ((*(char *)(local_150.d.size + uVar10) == '\0') &&
               (iVar6 = QTextTableCell::columnSpan((QTextTableCell *)local_1a8), iVar6 == 1)) {
              emitTextLength(this,"width",local_208.d.ptr + uVar10);
              *(undefined1 *)(local_150.d.size + uVar10) = 1;
            }
            iVar6 = QTextTableCell::columnSpan((QTextTableCell *)local_1a8);
            iVar9 = (int)&local_188;
            if (1 < iVar6) {
              iVar6 = QTextTableCell::columnSpan((QTextTableCell *)local_1a8);
              QString::number(iVar9,iVar6);
              emitAttribute(this,"colspan",(QString *)&local_188);
              if ((QArrayData *)local_188.a.a.m_size != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                     = (((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_188.a.a.m_size,2,0x10);
                }
              }
            }
            iVar6 = QTextTableCell::rowSpan((QTextTableCell *)local_1a8);
            if (1 < iVar6) {
              iVar6 = QTextTableCell::rowSpan((QTextTableCell *)local_1a8);
              QString::number(iVar9,iVar6);
              emitAttribute(this,"rowspan",(QString *)&local_188);
              if ((QArrayData *)local_188.a.a.m_size != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).super___atomic_base<int>._M_i
                     = (((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_188.a.a.m_size)->_q_value).super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate((QArrayData *)local_188.a.a.m_size,2,0x10);
                }
              }
            }
            local_1b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextTableCell::format((QTextTableCell *)&local_188);
            QTextFormat::toTableCellFormat((QTextFormat *)local_1b8);
            QTextFormat::~QTextFormat((QTextFormat *)&local_188);
            emitBackgroundAttribute(this,(QTextFormat *)local_1b8);
            local_1c8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_1c8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::QTextFormat((QTextFormat *)local_1c8,&rhs->super_QTextFormat);
            iVar6 = QTextFormat::intProperty((QTextFormat *)local_1b8,0x2021);
            local_228._0_8_ = (QArrayData *)0x0;
            local_228._8_8_ = (Data *)0x0;
            local_228._16_8_ = (Property *)0x0;
            if (iVar6 - 3U < 3) {
              QVar15.m_data = (char *)0x10;
              QVar15.m_size = (qsizetype)local_228;
              QString::append(QVar15);
              if (iVar6 == 5) {
                pcVar8 = &DAT_00000006;
              }
              else if (iVar6 == 4) {
                pcVar8 = (char *)0x3;
              }
              else {
                pcVar8 = &DAT_00000006;
              }
              QVar16.m_size = local_228;
              QVar16.m_data = pcVar8;
              QString::append(QVar16);
              QString::append((QChar)(char16_t)QVar16.m_size);
              local_1e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_1e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_1e8);
              ::QVariant::QVariant((QVariant *)&local_188,iVar6);
              QTextFormat::setProperty((QTextFormat *)&local_1e8,0x2021,(QVariant *)&local_188);
              ::QVariant::~QVariant((QVariant *)&local_188);
              QTextFormat::merge(&rhs->super_QTextFormat,(QTextFormat *)&local_1e8);
              QTextFormat::~QTextFormat((QTextFormat *)&local_1e8);
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4814);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4814);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xe;
              local_188.a.a.m_data = " padding-left:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4815);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4815);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xf;
              local_188.a.a.m_data = " padding-right:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4812);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4812);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xd;
              local_188.a.a.m_data = " padding-top:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4813);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4813);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0x10;
              local_188.a.a.m_data = " padding-bottom:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4816);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4816);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xc;
              local_188.a.a.m_data = " border-top:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = 3;
              local_188.b.m_data = "px;";
              ::operator+=((QString *)local_228,&local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4819);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4819);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xe;
              local_188.a.a.m_data = " border-right:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = 3;
              local_188.b.m_data = "px;";
              ::operator+=((QString *)local_228,&local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4817);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4817);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xf;
              local_188.a.a.m_data = " border-bottom:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = 3;
              local_188.b.m_data = "px;";
              ::operator+=((QString *)local_228,&local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4818);
            if (bVar2) {
              qVar1 = QTextFormat::doubleProperty((QTextFormat *)local_1b8,0x4818);
              QString::number(qVar1,(char)&local_1e8,0x67);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0xd;
              local_188.a.a.m_data = " border-left:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = 3;
              local_188.b.m_data = "px;";
              ::operator+=((QString *)local_228,&local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481e);
            iVar6 = (int)(QTextFormat *)local_1b8;
            if (bVar2) {
              QTextFormat::brushProperty((QTextFormat *)local_230,iVar6);
              QColor::name(&local_1e8,(QColor *)((long)local_230 + 8),HexRgb);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0x12;
              local_188.a.a.m_data = " border-top-color:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              QBrush::~QBrush((QBrush *)local_230);
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4821);
            if (bVar2) {
              QTextFormat::brushProperty((QTextFormat *)local_230,iVar6);
              QColor::name(&local_1e8,(QColor *)((long)local_230 + 8),HexRgb);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0x14;
              local_188.a.a.m_data = " border-right-color:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              QBrush::~QBrush((QBrush *)local_230);
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481f);
            if (bVar2) {
              QTextFormat::brushProperty((QTextFormat *)local_230,iVar6);
              QColor::name(&local_1e8,(QColor *)((long)local_230 + 8),HexRgb);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0x15;
              local_188.a.a.m_data = " border-bottom-color:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              QBrush::~QBrush((QBrush *)local_230);
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x4820);
            if (bVar2) {
              QTextFormat::brushProperty((QTextFormat *)local_230,iVar6);
              QColor::name(&local_1e8,(QColor *)((long)local_230 + 8),HexRgb);
              local_188.a.b.d.size = local_1e8.d.size;
              local_188.a.b.d.ptr = local_1e8.d.ptr;
              local_188.a.b.d.d = local_1e8.d.d;
              local_1e8.d.size = 0;
              local_188.a.a.m_size = 0x13;
              local_188.a.a.m_data = " border-left-color:";
              local_1e8.d.d = (Data *)0x0;
              local_1e8.d.ptr = (char16_t *)0x0;
              local_188.b.m_size = CONCAT62(local_188.b.m_size._2_6_,0x3b);
              ::operator+=((QString *)local_228,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString>,_char16_t> *)
                           &local_188);
              if ((QTextFormatPrivate *)local_188.a.b.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     = ((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.
                       super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if (((local_188.a.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                    _M_i == 0) {
                  QArrayData::deallocate(&(local_188.a.b.d.d)->super_QArrayData,2,0x10);
                }
              }
              if ((QTextFormatPrivate *)local_1e8.d.d != (QTextFormatPrivate *)0x0) {
                LOCK();
                *(int *)local_1e8.d.d = *(int *)local_1e8.d.d + -1;
                UNLOCK();
                if (*(int *)local_1e8.d.d == 0) {
                  QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,2,0x10);
                }
              }
              QBrush::~QBrush((QBrush *)local_230);
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481a);
            if (bVar2) {
              uVar4 = QTextFormat::intProperty((QTextFormat *)local_1b8,0x481a);
              (*(code *)(&DAT_006baea0 + *(int *)(&DAT_006baea0 + (ulong)uVar4 * 4)))();
              return;
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481d);
            if (bVar2) {
              uVar4 = QTextFormat::intProperty((QTextFormat *)local_1b8,0x481d);
              (*(code *)(&DAT_006baecc + *(int *)(&DAT_006baecc + (ulong)uVar4 * 4)))();
              return;
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481b);
            if (bVar2) {
              uVar4 = QTextFormat::intProperty((QTextFormat *)local_1b8,0x481b);
              (*(code *)(&DAT_006baef8 + *(int *)(&DAT_006baef8 + (ulong)uVar4 * 4)))();
              return;
            }
            bVar2 = QTextFormat::hasProperty((QTextFormat *)local_1b8,0x481c);
            if (bVar2) {
              uVar4 = QTextFormat::intProperty((QTextFormat *)local_1b8,0x481c);
              (*(code *)(&DAT_006baf24 + *(int *)(&DAT_006baf24 + (ulong)uVar4 * 4)))();
              return;
            }
            if ((Property *)local_228._16_8_ != (Property *)0x0) {
              local_188.a.a.m_size = 8;
              local_188.a.a.m_data = " style=\"";
              local_188.a.b.d.d = (Data *)local_228;
              local_188.a.b.d.ptr = (char16_t *)CONCAT62(local_188.a.b.d.ptr._2_6_,0x22);
              ::operator+=(&this->html,
                           (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t> *)
                           &local_188);
            }
            QString::append((QChar)(char16_t)this);
            QTextTableCell::begin((iterator *)&local_188,(QTextTableCell *)local_1a8);
            emitFrame(this,(Iterator *)&local_188);
            QVar17.m_data = &DAT_00000005;
            QVar17.m_size = (qsizetype)this;
            QString::append(QVar17);
            QTextFormat::operator=(&rhs->super_QTextFormat,(QTextFormat *)local_1c8);
            if ((QArrayData *)local_228._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_228._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_228._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_228._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_228._0_8_,2,0x10);
              }
            }
            QTextFormat::~QTextFormat((QTextFormat *)local_1c8);
            QTextFormat::~QTextFormat((QTextFormat *)local_1b8);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      QVar18.m_data = &DAT_00000005;
      QVar18.m_size = (qsizetype)this;
      QString::append(QVar18);
      if (0 < iVar5 && col == iVar5 + -1) {
        QVar19.m_data = (char *)0x8;
        QVar19.m_size = (qsizetype)this;
        QString::append(QVar19);
      }
      col = col + 1;
    } while (col != iVar3);
  }
  QVar20.m_data = (char *)0x8;
  QVar20.m_size = (qsizetype)this;
  QString::append(QVar20);
  if ((undefined1 *)local_150.d.size != local_138) {
    QtPrivate::sizedFree((void *)local_150.d.size,(ulong)local_150.d.d);
  }
  if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  QTextFormat::~QTextFormat((QTextFormat *)local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitTable(const QTextTable *table)
{
    QTextTableFormat format = table->format();

    html += "\n<table"_L1;

    if (format.hasProperty(QTextFormat::FrameBorder))
        emitAttribute("border", QString::number(format.border()));

    emitFrameStyle(format, TableFrame);

    emitAlignment(format.alignment());
    emitTextLength("width", format.width());

    if (format.hasProperty(QTextFormat::TableCellSpacing))
        emitAttribute("cellspacing", QString::number(format.cellSpacing()));
    if (format.hasProperty(QTextFormat::TableCellPadding))
        emitAttribute("cellpadding", QString::number(format.cellPadding()));

    emitBackgroundAttribute(format);

    html += u'>';

    const int rows = table->rows();
    const int columns = table->columns();

    QList<QTextLength> columnWidths = format.columnWidthConstraints();
    if (columnWidths.isEmpty()) {
        columnWidths.resize(columns);
        columnWidths.fill(QTextLength());
    }
    Q_ASSERT(columnWidths.size() == columns);

    QVarLengthArray<bool> widthEmittedForColumn(columns);
    for (int i = 0; i < columns; ++i)
        widthEmittedForColumn[i] = false;

    const int headerRowCount = qMin(format.headerRowCount(), rows);
    if (headerRowCount > 0)
        html += "<thead>"_L1;

    for (int row = 0; row < rows; ++row) {
        html += "\n<tr>"_L1;

        for (int col = 0; col < columns; ++col) {
            const QTextTableCell cell = table->cellAt(row, col);

            // for col/rowspans
            if (cell.row() != row)
                continue;

            if (cell.column() != col)
                continue;

            html += "\n<td"_L1;

            if (!widthEmittedForColumn[col] && cell.columnSpan() == 1) {
                emitTextLength("width", columnWidths.at(col));
                widthEmittedForColumn[col] = true;
            }

            if (cell.columnSpan() > 1)
                emitAttribute("colspan", QString::number(cell.columnSpan()));

            if (cell.rowSpan() > 1)
                emitAttribute("rowspan", QString::number(cell.rowSpan()));

            const QTextTableCellFormat cellFormat = cell.format().toTableCellFormat();
            emitBackgroundAttribute(cellFormat);

            QTextCharFormat oldDefaultCharFormat = defaultCharFormat;

            QTextCharFormat::VerticalAlignment valign = cellFormat.verticalAlignment();

            QString styleString;
            if (valign >= QTextCharFormat::AlignMiddle && valign <= QTextCharFormat::AlignBottom) {
                styleString += " vertical-align:"_L1;
                switch (valign) {
                case QTextCharFormat::AlignMiddle:
                    styleString += "middle"_L1;
                    break;
                case QTextCharFormat::AlignTop:
                    styleString += "top"_L1;
                    break;
                case QTextCharFormat::AlignBottom:
                    styleString += "bottom"_L1;
                    break;
                default:
                    break;
                }
                styleString += u';';

                QTextCharFormat temp;
                temp.setVerticalAlignment(valign);
                defaultCharFormat.merge(temp);
            }

            if (cellFormat.hasProperty(QTextFormat::TableCellLeftPadding))
                styleString += " padding-left:"_L1 + QString::number(cellFormat.leftPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightPadding))
                styleString += " padding-right:"_L1 + QString::number(cellFormat.rightPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellTopPadding))
                styleString += " padding-top:"_L1 + QString::number(cellFormat.topPadding()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomPadding))
                styleString += " padding-bottom:"_L1 + QString::number(cellFormat.bottomPadding()) + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorder))
                styleString += " border-top:"_L1 + QString::number(cellFormat.topBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorder))
                styleString += " border-right:"_L1 + QString::number(cellFormat.rightBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorder))
                styleString += " border-bottom:"_L1 + QString::number(cellFormat.bottomBorder()) + "px;"_L1;
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorder))
                styleString += " border-left:"_L1 + QString::number(cellFormat.leftBorder()) + "px;"_L1;

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderBrush))
                styleString += " border-top-color:"_L1 + cellFormat.topBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderBrush))
                styleString += " border-right-color:"_L1 + cellFormat.rightBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderBrush))
                styleString += " border-bottom-color:"_L1 + cellFormat.bottomBorderBrush().color().name() + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderBrush))
                styleString += " border-left-color:"_L1 + cellFormat.leftBorderBrush().color().name() + u';';

            if (cellFormat.hasProperty(QTextFormat::TableCellTopBorderStyle))
                styleString += " border-top-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.topBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellRightBorderStyle))
                styleString += " border-right-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.rightBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellBottomBorderStyle))
                styleString += " border-bottom-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.bottomBorderStyle()) + u';';
            if (cellFormat.hasProperty(QTextFormat::TableCellLeftBorderStyle))
                styleString += " border-left-style:"_L1 + richtextBorderStyleToHtmlBorderStyle(cellFormat.leftBorderStyle()) + u';';

            if (!styleString.isEmpty())
                html += " style=\""_L1 + styleString + u'\"';

            html += u'>';

            emitFrame(cell.begin());

            html += "</td>"_L1;

            defaultCharFormat = oldDefaultCharFormat;
        }

        html += "</tr>"_L1;
        if (headerRowCount > 0 && row == headerRowCount - 1)
            html += "</thead>"_L1;
    }

    html += "</table>"_L1;
}